

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bson.c
# Opt level: O0

void test_bson_append_maxkey(void)

{
  byte bVar1;
  bson_t *a;
  bson_t *b_00;
  bson_t *b2;
  bson_t *b;
  
  a = (bson_t *)bson_new();
  bVar1 = bson_append_maxkey(a,"maxkey",0xffffffff);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bson.c",
            0x2a4,"test_bson_append_maxkey","bson_append_maxkey (b, \"maxkey\", -1)");
    abort();
  }
  b_00 = get_bson("test37.bson");
  BSON_ASSERT_BSON_EQUAL(a,b_00);
  bson_destroy(a);
  bson_destroy(b_00);
  return;
}

Assistant:

static void
test_bson_append_maxkey (void)
{
   bson_t *b;
   bson_t *b2;

   b = bson_new ();
   BSON_ASSERT (bson_append_maxkey (b, "maxkey", -1));
   b2 = get_bson ("test37.bson");
   BSON_ASSERT_BSON_EQUAL (b, b2);
   bson_destroy (b);
   bson_destroy (b2);
}